

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t50(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *__s2;
  size_t sVar4;
  void *__s1;
  char utf8 [29];
  uint16_t little [8];
  uint16_t utf16_ref [23];
  char acStack_78 [32];
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  undefined6 uStack_30;
  undefined2 local_2a;
  undefined6 uStack_28;
  undefined8 uStack_22;
  
  builtin_strncpy(acStack_78 + 0x10,"domino: 🁡",0xd);
  builtin_strncpy(acStack_78,"⅛-note: 𝅘𝅥𝅮, ",0x10);
  uStack_28 = 0x3a006f006e;
  uStack_22 = 0xdc61d83c0020;
  uStack_38 = 0x20002cdd60d834;
  uStack_30 = 0x6d006f0064;
  local_2a = 0x69;
  local_48 = 0x2d215b;
  uStack_44 = 0x6f006e;
  uStack_40 = 0x650074;
  uStack_3c = 0x20003a;
  uVar2 = al_ustr_new_from_utf16();
  lVar3 = al_ustr_length(uVar2);
  if (lVar3 == 0x14) {
    log_printf("OK   %s\n","20 == al_ustr_length(us)");
  }
  else {
    log_printf("FAIL %s\n","20 == al_ustr_length(us)");
    error = error + 1;
  }
  __s2 = (char *)al_cstr(uVar2);
  iVar1 = strcmp(acStack_78,__s2);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == strcmp(utf8, al_cstr(us))");
  }
  else {
    log_printf("FAIL %s\n","0 == strcmp(utf8, al_cstr(us))");
    error = error + 1;
  }
  al_ustr_free(uVar2);
  uVar2 = al_ustr_new(acStack_78);
  sVar4 = al_ustr_size_utf16(uVar2);
  if (sVar4 == 0x2e) {
    log_printf("OK   %s\n","46 == s");
  }
  else {
    log_printf("FAIL %s\n","46 == s");
    error = error + 1;
  }
  __s1 = malloc(sVar4);
  al_ustr_encode_utf16(uVar2,__s1,sVar4);
  iVar1 = bcmp(__s1,&local_48,sVar4);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(utf16, utf16_ref, s)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(utf16, utf16_ref, s)");
    error = error + 1;
  }
  free(__s1);
  sVar4 = al_ustr_encode_utf16(uVar2,local_58,0x10);
  if (sVar4 == 0x10) {
    log_printf("OK   %s\n","16 == s");
  }
  else {
    log_printf("FAIL %s\n","16 == s");
    error = error + 1;
  }
  iVar1 = bcmp(&DAT_0010cf10,local_58,sVar4);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(truncated, little, s)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(truncated, little, s)");
    error = error + 1;
  }
  al_ustr_free(uVar2);
  return;
}

Assistant:

static void t50(void)
{
   ALLEGRO_USTR *us;
   char utf8[] = "⅛-note: 𝅘𝅥𝅮, domino: 🁡";
   uint16_t *utf16;
   size_t s;
   uint16_t little[8];
   /* Only native byte order supported right now, so have to specify
    * elements as uint16_t and not as char.
    */
   uint16_t utf16_ref[] = {
      0x215b, 0x002d, 0x006e, 0x006f, 0x0074,
      0x0065, 0x003a, 0x0020, 0xd834, 0xdd60,
      0x002c, 0x0020, 0x0064, 0x006f, 0x006d,
      0x0069, 0x006e, 0x006f, 0x003a, 0x0020,
      0xd83c, 0xdc61, 0x0000};
   uint16_t truncated[] = {
      0x215b, 0x002d, 0x006e, 0x006f, 0x0074,
      0x0065, 0x003a, 0x0000};

   us = al_ustr_new_from_utf16(utf16_ref);
   CHECK(20 == al_ustr_length(us));
   CHECK(0 == strcmp(utf8, al_cstr(us)));
   al_ustr_free(us);

   us = al_ustr_new(utf8);
   s = al_ustr_size_utf16(us);
   CHECK(46 == s);
   utf16 = malloc(s);
   al_ustr_encode_utf16(us, utf16, s);
   CHECK(0 == memcmp(utf16, utf16_ref, s));
   free(utf16);
   
   s = al_ustr_encode_utf16(us, little, sizeof little);
   CHECK(16 == s);
   CHECK(0 == memcmp(truncated, little, s));
   al_ustr_free(us);
}